

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SharedDirectory.cpp
# Opt level: O2

bool __thiscall SharedDirectory::can_read_file(SharedDirectory *this,string *name)

{
  bool bVar1;
  iterator iVar2;
  path pStack_58;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_38,(string *)name);
  path_in_dir(&pStack_58,this,&local_38);
  bVar1 = boost::filesystem::exists(&pStack_58);
  if (bVar1) {
    iVar2 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                    *)this,name);
    bVar1 = (_Rb_tree_header *)iVar2._M_node !=
            &(this->indexed_files)._M_t._M_impl.super__Rb_tree_header;
  }
  else {
    bVar1 = false;
  }
  std::__cxx11::string::~string((string *)&pStack_58);
  std::__cxx11::string::~string((string *)&local_38);
  return bVar1;
}

Assistant:

bool SharedDirectory::can_read_file(const std::string &name) {
  return exists(path_in_dir(name)) && indexed_files.find(name) != indexed_files.end();
}